

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O2

void duckdb::SortedAggregateState::LinkedAppend
               (LinkedChunkFunctions *functions,ArenaAllocator *allocator,DataChunk *input,
               LinkedLists *linked,SelectionVector *sel,idx_t nsel)

{
  idx_t count;
  const_reference this;
  reference linked_list;
  reference input_00;
  idx_t i;
  ulong uVar1;
  ulong __n;
  idx_t sidx;
  RecursiveUnifiedVectorFormat input_data;
  
  count = input->count;
  for (__n = 0; __n < (ulong)(((long)(input->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(input->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x68);
      __n = __n + 1) {
    this = vector<duckdb::ListSegmentFunctions,_true>::get<true>(functions,__n);
    linked_list = vector<duckdb::LinkedList,_true>::get<true>(linked,__n);
    RecursiveUnifiedVectorFormat::RecursiveUnifiedVectorFormat(&input_data);
    input_00 = vector<duckdb::Vector,_true>::get<true>(&input->data,__n);
    Vector::RecursiveToUnifiedFormat(input_00,count,&input_data);
    for (uVar1 = 0; nsel != uVar1; uVar1 = uVar1 + 1) {
      sidx = uVar1;
      if (sel->sel_vector != (sel_t *)0x0) {
        sidx = (idx_t)sel->sel_vector[uVar1];
      }
      ListSegmentFunctions::AppendRow(this,allocator,linked_list,&input_data,&sidx);
    }
    RecursiveUnifiedVectorFormat::~RecursiveUnifiedVectorFormat(&input_data);
  }
  return;
}

Assistant:

static void LinkedAppend(const LinkedChunkFunctions &functions, ArenaAllocator &allocator, DataChunk &input,
	                         LinkedLists &linked, SelectionVector &sel, idx_t nsel) {
		const auto count = input.size();
		for (column_t c = 0; c < input.ColumnCount(); ++c) {
			auto &func = functions[c];
			auto &linked_list = linked[c];
			RecursiveUnifiedVectorFormat input_data;
			Vector::RecursiveToUnifiedFormat(input.data[c], count, input_data);
			for (idx_t i = 0; i < nsel; ++i) {
				idx_t sidx = sel.get_index(i);
				func.AppendRow(allocator, linked_list, input_data, sidx);
			}
		}
	}